

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::GenerateMaterials(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  aiMaterial *this_00;
  aiMaterial **ppaVar1;
  aiString s;
  char local_434 [16];
  aiString local_424;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_424.length = 0;
  local_424.data[0] = '\0';
  memset(local_424.data + 1,0x1b,0x3ff);
  local_424.length = 0xf;
  builtin_strncpy(local_424.data,"DefaultMaterial",0x10);
  aiMaterial::AddProperty(this_00,&local_424,"?mat.name",0,0);
  builtin_strncpy(local_434,"fff?fff?fff?",0xd);
  local_434[0xd] = '\0';
  local_434[0xe] = -0x80;
  local_434[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_434,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  local_434[0] = '\0';
  local_434[1] = '\0';
  local_434[2] = -0x80;
  local_434[3] = '?';
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = -0x80;
  local_434[7] = '?';
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = -0x80;
  local_434[0xb] = '?';
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = -0x80;
  local_434[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_434,0x10,"$clr.specular",0,0,aiPTI_Float);
  local_434[0] = -0x33;
  local_434[1] = -0x34;
  local_434[2] = 'L';
  local_434[3] = '=';
  local_434[4] = -0x33;
  local_434[5] = -0x34;
  local_434[6] = 'L';
  local_434[7] = '=';
  local_434[8] = -0x33;
  local_434[9] = -0x34;
  local_434[10] = 'L';
  local_434[0xb] = '=';
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = -0x80;
  local_434[0xf] = '?';
  aiMaterial::AddBinaryProperty(this_00,local_434,0x10,"$clr.ambient",0,0,aiPTI_Float);
  pScene->mNumMaterials = 1;
  ppaVar1 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar1;
  *ppaVar1 = this_00;
  return;
}

Assistant:

void DXFImporter::GenerateMaterials(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate an almost-white default material. Reason:
    // the default vertex color is GREY, so we are
    // already at Assimp's usual default color.
    // generate a default material
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(0.9f,0.9f,0.9f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);

    clrDiffuse = aiColor4D(1.0f,1.0f,1.0f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);

    clrDiffuse = aiColor4D(0.05f,0.05f,0.05f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;
}